

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::DuplicateItems(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *this,SizeType index1,SizeType index2)

{
  undefined4 uVar1;
  CrtAllocator *pCVar2;
  StringRefType *rhs;
  GenericStringRef<char> local_48 [2];
  undefined1 local_28 [8];
  ValueType duplicates;
  SizeType index2_local;
  SizeType index1_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  duplicates.data_._8_4_ = index2;
  duplicates.data_._12_4_ = index1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,kArrayType);
  uVar1 = duplicates.data_._12_4_;
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,uVar1,pCVar2);
  uVar1 = duplicates.data_._8_4_;
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,uVar1,pCVar2);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetObject(&this->currentError_);
  rhs = GetDuplicatesString();
  GenericStringRef<char>::GenericStringRef(local_48,rhs);
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,local_48,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,pCVar2);
  AddCurrentError(this,kValidateErrorUniqueItems,true);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28);
  return;
}

Assistant:

void DuplicateItems(SizeType index1, SizeType index2) {
        ValueType duplicates(kArrayType);
        duplicates.PushBack(index1, GetStateAllocator());
        duplicates.PushBack(index2, GetStateAllocator());
        currentError_.SetObject();
        currentError_.AddMember(GetDuplicatesString(), duplicates, GetStateAllocator());
        AddCurrentError(kValidateErrorUniqueItems, true);
    }